

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

void __thiscall
QUtcTimeZonePrivate::QUtcTimeZonePrivate(QUtcTimeZonePrivate *this,qint32 offsetSeconds)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  Data *data;
  ushort *puVar4;
  void *pvVar5;
  ushort uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  size_t size;
  ulong uVar10;
  qsizetype qVar11;
  QArrayData *data_00;
  size_t __n;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_88;
  QArrayData *local_68;
  char16_t *pcStack_60;
  QString *local_58;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QTimeZonePrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  (this->super_QTimeZonePrivate).m_id.d.d = (Data *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.ptr = (char *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.size = 0;
  (this->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QUtcTimeZonePrivate_0069f5f8;
  (this->m_name).d.d = (Data *)0x0;
  (this->m_name).d.ptr = (char16_t *)0x0;
  (this->m_name).d.size = 0;
  (this->m_abbreviation).d.d = (Data *)0x0;
  (this->m_abbreviation).d.ptr = (char16_t *)0x0;
  (this->m_abbreviation).d.size = 0;
  (this->m_comment).d.d = (Data *)0x0;
  (this->m_comment).d.ptr = (char16_t *)0x0;
  (this->m_comment).d.size = 0;
  local_48.d.size = 0;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_58 = (QString *)0x0;
  local_68 = (QArrayData *)0x0;
  pcStack_60 = (char16_t *)0x0;
  uVar7 = 0x2a;
  puVar4 = &QtTimeZoneCldr::utcDataTable;
  do {
    uVar9 = uVar7 >> 1;
    uVar10 = ~uVar9 + uVar7;
    uVar7 = uVar9;
    if (*(int *)(puVar4 + uVar9 * 4 + 2) < offsetSeconds) {
      puVar4 = puVar4 + uVar9 * 4 + 4;
      uVar7 = uVar10;
    }
  } while (0 < (long)uVar7);
  pcVar8 = "16QTimeZonePrivate";
  if ((puVar4 == (ushort *)"16QTimeZonePrivate") || (*(int *)(puVar4 + 2) != offsetSeconds)) {
    QTimeZonePrivate::isoOffsetFormat(&local_88,offsetSeconds,ShortName);
    pcVar3 = local_48.d.ptr;
    data = local_48.d.d;
    qVar11 = local_88.d.size;
    pDVar2 = local_88.d.d;
    local_88.d.d = local_48.d.d;
    local_48.d.d = pDVar2;
    local_48.d.ptr = local_88.d.ptr;
    local_88.d.ptr = pcVar3;
    local_88.d.size = local_48.d.size;
    local_48.d.size = qVar11;
    if (&data->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&data->super_QArrayData,2,0x10);
      }
    }
    QString::toUtf8_helper((QByteArray *)&local_88,&local_48);
    pcVar3 = pcStack_60;
    data_00 = local_68;
    qVar11 = local_88.d.size;
    pDVar2 = local_88.d.d;
    local_88.d.d = (Data *)local_68;
    local_68 = &pDVar2->super_QArrayData;
    pcStack_60 = local_88.d.ptr;
    local_88.d.ptr = pcVar3;
    local_88.d.size = (qsizetype)local_58;
    local_58 = (QString *)qVar11;
    if (data_00 == (QArrayData *)0x0) goto LAB_003f6ade;
    LOCK();
    (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
         (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_003f6ade;
    qVar11 = 1;
  }
  else {
    uVar7 = (ulong)*puVar4;
    puVar4 = (ushort *)("Asia/Kabul" + uVar7);
    __n = 0xffffffffffffffff;
    do {
      lVar1 = __n + uVar7 + 1;
      __n = __n + 1;
    } while ("Asia/Kabul"[lVar1] != '\0');
    if (__n == 0) {
      size = 0;
    }
    else {
      pvVar5 = memchr(puVar4,0x20,__n);
      size = (long)pvVar5 - (long)puVar4;
      if ((long)pvVar5 - (long)puVar4 < 0) {
        size = __n;
      }
      if (pvVar5 == (void *)0x0) {
        size = __n;
      }
      if (size == 3) {
        uVar6 = (byte)"Asia/Kabul"[uVar7 + 2] ^ 0x43 | *puVar4 ^ 0x5455;
        pcVar8 = (char *)(ulong)uVar6;
        size = 3;
        if (uVar6 == 0) {
          pcStack_60 = L"UTC";
          local_58 = (QString *)0x3;
          local_48.d.d = (Data *)0x0;
          local_48.d.ptr = L"UTC";
          local_48.d.size = 3;
          goto LAB_003f6ade;
        }
      }
    }
    QByteArray::QByteArray((QByteArray *)&local_88,(char *)puVar4,size);
    local_68 = &(local_88.d.d)->super_QArrayData;
    pcStack_60 = local_88.d.ptr;
    local_58 = (QString *)local_88.d.size;
    ba.m_data = pcVar8;
    ba.m_size = (qsizetype)local_88.d.ptr;
    QString::fromUtf8(&local_88,(QString *)local_88.d.size,ba);
    pcVar3 = local_48.d.ptr;
    data_00 = &(local_48.d.d)->super_QArrayData;
    qVar11 = local_88.d.size;
    pDVar2 = local_88.d.d;
    local_88.d.d = local_48.d.d;
    local_48.d.d = pDVar2;
    local_48.d.ptr = local_88.d.ptr;
    local_88.d.ptr = pcVar3;
    local_88.d.size = local_48.d.size;
    local_48.d.size = qVar11;
    if (data_00 == (QArrayData *)0x0) goto LAB_003f6ade;
    LOCK();
    (((Data *)data_00)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)data_00)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((Data *)data_00)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_003f6ade;
    qVar11 = 2;
  }
  local_88.d.d = (Data *)data_00;
  QArrayData::deallocate(data_00,qVar11,0x10);
LAB_003f6ade:
  init(this,(EVP_PKEY_CTX *)&local_68);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUtcTimeZonePrivate::QUtcTimeZonePrivate(qint32 offsetSeconds)
{
    QString name;
    QByteArray id;
    // If there's an IANA ID for this offset, use it:
    const auto data = std::lower_bound(std::begin(utcDataTable), std::end(utcDataTable),
                                       offsetSeconds, atLowerUtcOffset);
    if (data != std::end(utcDataTable) && data->offsetFromUtc == offsetSeconds) {
        QByteArrayView ianaId = data->id();
        qsizetype cut = ianaId.indexOf(' ');
        QByteArrayView cutId = (cut < 0 ? ianaId : ianaId.first(cut));
        if (cutId == utcQByteArray()) {
            // optimize: reuse interned strings for the common case
            id = utcQByteArray();
            name = utcQString();
        } else {
            // fallback to allocate new strings otherwise
            id = cutId.toByteArray();
            name = QString::fromUtf8(id);
        }
        Q_ASSERT(!name.isEmpty());
    } else { // Fall back to a UTC-offset name:
        name = isoOffsetFormat(offsetSeconds, QTimeZone::ShortName);
        id = name.toUtf8();
    }
    init(id, offsetSeconds, name, name, QLocale::AnyTerritory, name);
}